

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec3 vec3_rotate_z(vec3 v,float theta)

{
  vec3 vVar1;
  
  vVar1 = vec3_rotate_about_axis(v,(vec3)(ZEXT412(0x3f800000) << 0x40),theta);
  return vVar1;
}

Assistant:

vec3 vec3_rotate_z(vec3 v, float theta) {
    return vec3_rotate_about_axis(v, V3(0.0f, 0.0f, 1.0f), theta);
}